

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

shared_ptr<FBX::Mesh> __thiscall FBX::Parser::parseMesh(Parser *this,Node *node,Vector3 up)

{
  _Rb_tree_node_base *p_Var1;
  Mesh *this_00;
  Node *in_RDX;
  undefined8 extraout_RDX;
  undefined1 auVar2 [16];
  shared_ptr<FBX::Mesh> sVar3;
  
  this_00 = (Mesh *)operator_new(0x70);
  Mesh::Mesh(this_00,in_RDX);
  this->root = (Node *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FBX::Mesh*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->processes,this_00);
  auVar2._8_8_ = extraout_RDX;
  auVar2._0_8_ = (node->id).field_2._M_allocated_capacity;
  while (p_Var1 = auVar2._0_8_, p_Var1 != (_Rb_tree_node_base *)&node->id) {
    (**(code **)(**(long **)(p_Var1 + 1) + 0x10))(*(long **)(p_Var1 + 1),this);
    auVar2 = std::_Rb_tree_increment(p_Var1);
  }
  sVar3.super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = auVar2._8_8_;
  sVar3.super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<FBX::Mesh>)sVar3.super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Mesh> Parser::parseMesh(const Node &node, const Vector3 up) const {
        std::shared_ptr<Mesh> mesh(new Mesh(node));

        for (const auto &process : processes)
            process->execute(mesh);

        for (auto &vertex : mesh->vertices) {
            Vector3 v = vertex;

            // TODO
            /*if (processes & MAKE_X_UP) {
                if (up == 1)
                    v = Vector3(vertex.y, vertex.x, vertex.z);
                else if (up == 2)
                    v = Vector3(vertex.z, vertex.y, vertex.x);
            } else if (processes & MAKE_Y_UP) {
                if (up == 0)
                    v = Vector3(vertex.y, vertex.x, vertex.z);
                else if (up == 2)
                    v = Vector3(vertex.x, vertex.z, vertex.y);
            } else if (processes & MAKE_Z_UP) {
                if (up == 0)
                    v = Vector3(vertex.z, vertex.y, vertex.x);
                else if (up == 1)
                    v = Vector3(vertex.x, vertex.z, vertex.y);
            }*/

            vertex = v;
        }

        return mesh;
    }